

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationfastlatin.cpp
# Opt level: O3

int32_t icu_63::CollationFastLatin::compareUTF8
                  (uint16_t *table,uint16_t *primaries,int32_t options,uint8_t *left,
                  int32_t leftLength,uint8_t *right,int32_t rightLength)

{
  uint16_t *table_00;
  byte bVar1;
  int iVar2;
  uint uVar3;
  uint32_t uVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  uint32_t uVar12;
  uint uVar13;
  bool bVar14;
  bool bVar15;
  int32_t rightIndex;
  int32_t leftIndex;
  int32_t local_54;
  int32_t local_50;
  int local_4c;
  uint8_t *local_48;
  uint local_40;
  uint local_3c;
  uint16_t *local_38;
  
  table_00 = table + (byte)*table;
  uVar11 = (uint)options >> 0x10;
  local_3c = options & 0xffff;
  local_50 = 0;
  local_54 = 0;
  uVar4 = 0;
  uVar12 = 0;
  local_4c = leftLength;
  local_48 = right;
  local_40 = options;
  local_38 = primaries;
LAB_0023fc0d:
  do {
    if (uVar12 == 0) {
      if (local_50 == local_4c) {
        uVar12 = 2;
      }
      else {
        lVar9 = (long)local_50 + 1;
        iVar8 = (int)lVar9;
        bVar1 = left[local_50];
        lVar6 = (long)(char)bVar1;
        uVar3 = (uint)bVar1;
        if (lVar6 < 0) {
          if ((((byte)(bVar1 + 0x3a) < 0xfc) || (iVar8 == local_4c)) || (-0x41 < (char)left[lVar9]))
          {
            local_50 = iVar8;
            uVar12 = lookupUTF8(table_00,(uint)bVar1,left,&local_50,local_4c);
          }
          else {
            local_50 = local_50 + 2;
            uVar3 = ((uint)bVar1 * 0x40 + (uint)left[lVar9]) - 0x3080;
            uVar12 = (uint32_t)local_38[uVar3];
            if (local_38[uVar3] != 0) goto LAB_0023fd56;
            uVar12 = (uint32_t)table_00[uVar3];
          }
        }
        else {
          uVar12 = (uint32_t)local_38[lVar6];
          local_50 = iVar8;
          if (local_38[lVar6] != 0) goto LAB_0023fd56;
          if (((local_40 & 2) != 0) && (0xf5 < (byte)(bVar1 - 0x3a))) {
            return -2;
          }
          uVar12 = (uint32_t)table_00[lVar6];
        }
        if (uVar12 < 0x1000) {
          if (uVar12 <= uVar11) {
            uVar12 = nextPair(table_00,uVar3,uVar12,(UChar *)0x0,left,&local_50,&local_4c);
            if (uVar12 == 1) {
              return -2;
            }
            uVar3 = uVar12 & 0xffff;
            if (uVar3 < 0x1000) {
              if (uVar11 < uVar3) {
                uVar12 = uVar12 & 0xfff8fff8;
              }
              else if (0xbff < uVar3) {
                uVar12 = 0;
              }
            }
            else {
              uVar12 = uVar12 & 0xfc00fc00;
            }
            goto LAB_0023fc0d;
          }
          uVar12 = uVar12 & 0xff8;
        }
        else {
          uVar12 = uVar12 & 0xfc00;
        }
      }
    }
LAB_0023fd56:
    while (uVar4 == 0) {
      if (local_54 == rightLength) {
        uVar4 = 2;
        break;
      }
      lVar9 = (long)local_54 + 1;
      iVar8 = (int)lVar9;
      bVar1 = local_48[local_54];
      lVar6 = (long)(char)bVar1;
      uVar3 = (uint)bVar1;
      if (lVar6 < 0) {
        if ((((byte)(bVar1 + 0x3a) < 0xfc) || (iVar8 == rightLength)) ||
           (-0x41 < (char)local_48[lVar9])) {
          local_54 = iVar8;
          uVar4 = lookupUTF8(table_00,(uint)bVar1,local_48,&local_54,rightLength);
        }
        else {
          local_54 = local_54 + 2;
          uVar3 = ((uint)bVar1 * 0x40 + (uint)local_48[lVar9]) - 0x3080;
          uVar4 = (uint32_t)local_38[uVar3];
          if (local_38[uVar3] != 0) break;
          uVar4 = (uint32_t)table_00[uVar3];
        }
      }
      else {
        uVar4 = (uint32_t)local_38[lVar6];
        local_54 = iVar8;
        if (local_38[lVar6] != 0) break;
        if (((local_40 & 2) != 0) && (0xf5 < (byte)(bVar1 - 0x3a))) {
          return -2;
        }
        uVar4 = (uint32_t)table_00[lVar6];
      }
      if (0xfff < uVar4) {
        uVar4 = uVar4 & 0xfc00;
        break;
      }
      if (uVar11 < uVar4) {
        uVar4 = uVar4 & 0xff8;
        break;
      }
      uVar4 = nextPair(table_00,uVar3,uVar4,(UChar *)0x0,local_48,&local_54,&rightLength);
      if (uVar4 == 1) {
        return -2;
      }
      uVar3 = uVar4 & 0xffff;
      if (uVar3 < 0x1000) {
        if (uVar11 < uVar3) {
          uVar4 = uVar4 & 0xfff8fff8;
        }
        else if (0xbff < uVar3) {
          uVar4 = 0;
        }
      }
      else {
        uVar4 = uVar4 & 0xfc00fc00;
      }
    }
    if (uVar12 != uVar4) {
      uVar3 = uVar12 & 0xffff;
      uVar5 = uVar4 & 0xffff;
      if (uVar3 != uVar5) goto LAB_00240633;
      if (uVar12 == 2) break;
      uVar12 = uVar12 >> 0x10;
      uVar4 = uVar4 >> 0x10;
      goto LAB_0023fc0d;
    }
    uVar4 = 0;
    bVar14 = uVar12 != 2;
    uVar12 = 0;
  } while (bVar14);
  if (0xfff < local_3c) {
    uVar12 = 0;
    local_54 = 0;
    local_50 = 0;
    uVar4 = 0;
    iVar8 = local_50;
joined_r0x00240160:
    do {
      local_50 = iVar8;
      uVar13 = uVar4;
      if (uVar4 == 0) {
        if (iVar8 == local_4c) {
          uVar13 = 2;
        }
        else {
          local_50 = iVar8 + 1;
          bVar1 = left[iVar8];
          uVar7 = (ulong)(char)bVar1;
          if ((long)uVar7 < 0) {
            if (bVar1 < 0xc6) {
              local_50 = iVar8 + 2;
              uVar7 = ((ulong)bVar1 * 0x40 + (ulong)left[(long)iVar8 + 1]) - 0x3080;
              goto LAB_00240220;
            }
            local_50 = iVar8 + 3;
            if (bVar1 == 0xe2) {
              uVar7 = (ulong)(uint)left[(long)iVar8 + 2] | 0x100;
              goto LAB_00240220;
            }
            uVar3 = 3;
            if (left[(long)iVar8 + 2] != 0xbe) {
              uVar3 = 0xfca8;
              goto LAB_00240367;
            }
          }
          else {
LAB_00240220:
            uVar3 = (uint)table_00[uVar7];
            if (0xfff < table_00[uVar7]) {
LAB_00240367:
              uVar3 = uVar3 & 0x3e0;
              uVar13 = uVar3 * 0x10000 + 0x2000c0;
              if (uVar3 < 0x180) {
                uVar13 = uVar3 + 0x20;
              }
              goto joined_r0x00240164;
            }
          }
          if (uVar3 <= uVar11) {
            uVar4 = nextPair(table_00,(uint)bVar1,uVar3,(UChar *)0x0,left,&local_50,&local_4c);
            uVar4 = getSecondaries(uVar11,uVar4);
            iVar8 = local_50;
            goto joined_r0x00240160;
          }
          uVar13 = 0xc0;
        }
      }
joined_r0x00240164:
      while (uVar12 == 0) {
        if (local_54 == rightLength) {
          uVar12 = 2;
          break;
        }
        bVar1 = local_48[local_54];
        uVar7 = (ulong)(char)bVar1;
        iVar8 = local_54 + 1;
        if ((long)uVar7 < 0) {
          if (bVar1 < 0xc6) {
            uVar7 = ((ulong)bVar1 * 0x40 + (ulong)local_48[(long)local_54 + 1]) - 0x3080;
            iVar8 = local_54 + 2;
            goto LAB_002402ee;
          }
          lVar6 = (long)local_54;
          local_54 = local_54 + 3;
          if (bVar1 == 0xe2) {
            uVar7 = (ulong)(uint)local_48[lVar6 + 2] | 0x100;
            iVar8 = local_54;
            goto LAB_002402ee;
          }
          uVar3 = 3;
          if (local_48[lVar6 + 2] != 0xbe) {
            uVar3 = 0xfca8;
            goto LAB_00240392;
          }
        }
        else {
LAB_002402ee:
          local_54 = iVar8;
          uVar3 = (uint)table_00[uVar7];
          if (0xfff < table_00[uVar7]) {
LAB_00240392:
            uVar3 = uVar3 & 0x3e0;
            uVar12 = uVar3 * 0x10000 + 0x2000c0;
            if (uVar3 < 0x180) {
              uVar12 = uVar3 + 0x20;
            }
            break;
          }
        }
        if (uVar11 < uVar3) {
          uVar12 = 0xc0;
          break;
        }
        uVar4 = nextPair(table_00,(uint)bVar1,uVar3,(UChar *)0x0,local_48,&local_54,&rightLength);
        uVar12 = getSecondaries(uVar11,uVar4);
      }
      iVar8 = local_50;
      if (uVar13 != uVar12) {
        uVar3 = uVar13 & 0xffff;
        uVar5 = uVar12 & 0xffff;
        if (uVar3 != uVar5) {
          if ((local_40 >> 0xb & 1) != 0) {
            return -2;
          }
          goto LAB_00240633;
        }
        if (uVar13 == 2) break;
        uVar4 = uVar13 >> 0x10;
        uVar12 = uVar12 >> 0x10;
        goto joined_r0x00240160;
      }
      uVar12 = 0;
      uVar4 = 0;
    } while (uVar13 != 2);
  }
  if ((local_40 >> 10 & 1) != 0) {
    bVar14 = local_3c < 0x1000;
    uVar12 = 0;
    local_54 = 0;
    local_50 = 0;
    uVar4 = 0;
    iVar8 = local_50;
joined_r0x002403da:
    do {
      iVar2 = local_54;
      local_50 = iVar8;
      if (uVar4 == 0) {
        lVar6 = (long)iVar8;
        if (iVar8 != local_4c) {
          local_50 = (int32_t)(lVar6 + 1);
          bVar1 = left[lVar6];
          uVar7 = (ulong)(char)bVar1;
          if ((long)uVar7 < 0) {
            if (bVar1 < 0xc6) {
              local_50 = iVar8 + 2;
              uVar7 = ((ulong)bVar1 * 0x40 + (ulong)left[lVar6 + 1]) - 0x3080;
              goto LAB_0024045c;
            }
            local_50 = iVar8 + 3;
            if (bVar1 == 0xe2) {
              uVar7 = (ulong)(uint)left[lVar6 + 2] | 0x100;
              goto LAB_0024045c;
            }
            uVar4 = 0xfca8;
            uVar3 = 3;
            if (left[lVar6 + 2] == 0xbe) goto LAB_0024046b;
          }
          else {
LAB_0024045c:
            uVar4 = (uint32_t)table_00[uVar7];
            uVar3 = uVar4;
            if (table_00[uVar7] < 0xc00) {
LAB_0024046b:
              uVar4 = nextPair(table_00,(uint)bVar1,uVar3,(UChar *)0x0,left,&local_50,&local_4c);
            }
          }
          uVar4 = getCases(uVar11,bVar14,uVar4);
          iVar8 = local_50;
          goto joined_r0x002403da;
        }
        uVar4 = 2;
      }
      while (uVar12 == 0) {
        lVar6 = (long)iVar2;
        if (iVar2 == rightLength) {
          uVar12 = 2;
          break;
        }
        local_54 = (int32_t)(lVar6 + 1);
        bVar1 = local_48[lVar6];
        uVar7 = (ulong)(char)bVar1;
        if ((long)uVar7 < 0) {
          if (bVar1 < 0xc6) {
            local_54 = iVar2 + 2;
            uVar7 = ((ulong)bVar1 * 0x40 + (ulong)local_48[lVar6 + 1]) - 0x3080;
            goto LAB_0024053e;
          }
          local_54 = iVar2 + 3;
          if (bVar1 == 0xe2) {
            uVar7 = (ulong)(uint)local_48[lVar6 + 2] | 0x100;
            goto LAB_0024053e;
          }
          uVar12 = 0xfca8;
          uVar3 = 3;
          if (local_48[lVar6 + 2] == 0xbe) goto LAB_0024054d;
        }
        else {
LAB_0024053e:
          uVar12 = (uint32_t)table_00[uVar7];
          uVar3 = uVar12;
          if (table_00[uVar7] < 0xc00) {
LAB_0024054d:
            uVar12 = nextPair(table_00,(uint)bVar1,uVar3,(UChar *)0x0,local_48,&local_54,
                              &rightLength);
          }
        }
        uVar12 = getCases(uVar11,bVar14,uVar12);
        iVar2 = local_54;
      }
      local_54 = iVar2;
      iVar8 = local_50;
      if (uVar4 != uVar12) {
        uVar3 = uVar4 & 0xffff;
        uVar5 = uVar12 & 0xffff;
        if (uVar3 != uVar5) {
          if ((local_40 >> 8 & 1) == 0) goto LAB_00240633;
          uVar11 = (uVar3 < uVar5) - 1;
          goto LAB_0024063b;
        }
        if (uVar4 == 2) break;
        uVar4 = uVar4 >> 0x10;
        uVar12 = uVar12 >> 0x10;
        goto joined_r0x002403da;
      }
      uVar12 = 0;
      bVar15 = uVar4 != 2;
      uVar4 = 0;
    } while (bVar15);
  }
  if (0x1fff < local_3c) {
    bVar14 = (local_40 & 0x600) == 0x200;
    uVar12 = 0;
    local_54 = 0;
    local_50 = 0;
    uVar4 = 0;
    iVar8 = local_50;
joined_r0x0023ff4c:
    do {
      iVar2 = local_54;
      local_50 = iVar8;
      if (uVar4 == 0) {
        lVar6 = (long)iVar8;
        if (iVar8 != local_4c) {
          local_50 = (int32_t)(lVar6 + 1);
          bVar1 = left[lVar6];
          uVar7 = (ulong)(char)bVar1;
          if ((long)uVar7 < 0) {
            if (bVar1 < 0xc6) {
              local_50 = iVar8 + 2;
              uVar7 = ((ulong)bVar1 * 0x40 + (ulong)left[lVar6 + 1]) - 0x3080;
              goto LAB_0023ffce;
            }
            local_50 = iVar8 + 3;
            if (bVar1 == 0xe2) {
              uVar7 = (ulong)(uint)left[lVar6 + 2] | 0x100;
              goto LAB_0023ffce;
            }
            uVar4 = 0xfca8;
            uVar3 = 3;
            if (left[lVar6 + 2] == 0xbe) goto LAB_0023ffdd;
          }
          else {
LAB_0023ffce:
            uVar4 = (uint32_t)table_00[uVar7];
            uVar3 = uVar4;
            if (table_00[uVar7] < 0xc00) {
LAB_0023ffdd:
              uVar4 = nextPair(table_00,(uint)bVar1,uVar3,(UChar *)0x0,left,&local_50,&local_4c);
            }
          }
          uVar4 = getTertiaries(uVar11,bVar14,uVar4);
          iVar8 = local_50;
          goto joined_r0x0023ff4c;
        }
        uVar4 = 2;
      }
      while (uVar12 == 0) {
        lVar6 = (long)iVar2;
        if (iVar2 == rightLength) {
          uVar12 = 2;
          break;
        }
        local_54 = (int32_t)(lVar6 + 1);
        bVar1 = local_48[lVar6];
        uVar7 = (ulong)(char)bVar1;
        if ((long)uVar7 < 0) {
          if (bVar1 < 0xc6) {
            local_54 = iVar2 + 2;
            uVar7 = ((ulong)bVar1 * 0x40 + (ulong)local_48[lVar6 + 1]) - 0x3080;
            goto LAB_002400b0;
          }
          local_54 = iVar2 + 3;
          if (bVar1 == 0xe2) {
            uVar7 = (ulong)(uint)local_48[lVar6 + 2] | 0x100;
            goto LAB_002400b0;
          }
          uVar12 = 0xfca8;
          uVar3 = 3;
          if (local_48[lVar6 + 2] == 0xbe) goto LAB_002400bf;
        }
        else {
LAB_002400b0:
          uVar12 = (uint32_t)table_00[uVar7];
          uVar3 = uVar12;
          if (table_00[uVar7] < 0xc00) {
LAB_002400bf:
            uVar12 = nextPair(table_00,(uint)bVar1,uVar3,(UChar *)0x0,local_48,&local_54,
                              &rightLength);
          }
        }
        uVar12 = getTertiaries(uVar11,bVar14,uVar12);
        iVar2 = local_54;
      }
      local_54 = iVar2;
      iVar8 = local_50;
      if (uVar4 != uVar12) {
        uVar3 = uVar4 & 0xffff;
        uVar5 = uVar12 & 0xffff;
        if (uVar3 != uVar5) {
          if ((local_40 & 0x700) == 0x300) {
            if (3 < uVar3) {
              uVar3 = uVar3 ^ 0x18;
            }
            if (3 < uVar5) {
              uVar5 = uVar5 ^ 0x18;
            }
          }
          goto LAB_00240633;
        }
        if (uVar4 == 2) break;
        uVar4 = uVar4 >> 0x10;
        uVar12 = uVar12 >> 0x10;
        goto joined_r0x0023ff4c;
      }
      uVar12 = 0;
      bVar15 = uVar4 != 2;
      uVar4 = 0;
    } while (bVar15);
    if (0x2fff < local_3c) {
      uVar13 = 0;
      local_54 = 0;
      local_50 = 0;
      uVar10 = 0;
LAB_0024065a:
      if (uVar10 == 0) {
        lVar6 = (long)local_50;
        if (local_50 == local_4c) {
          uVar10 = 2;
        }
        else {
          bVar1 = left[lVar6];
          uVar7 = (ulong)(char)bVar1;
          iVar8 = (int)(lVar6 + 1);
          if ((long)uVar7 < 0) {
            if (bVar1 < 0xc6) {
              uVar7 = ((ulong)bVar1 * 0x40 + (ulong)left[lVar6 + 1]) - 0x3080;
              iVar8 = local_50 + 2;
              goto LAB_002406c5;
            }
            local_50 = local_50 + 3;
            if (bVar1 == 0xe2) {
              uVar7 = (ulong)left[lVar6 + 2] | 0x100;
              iVar8 = local_50;
              goto LAB_002406c5;
            }
            uVar3 = 3;
            if (left[lVar6 + 2] == 0xbe) goto LAB_002406d1;
            uVar3 = 0xfca8;
          }
          else {
LAB_002406c5:
            local_50 = iVar8;
            uVar3 = (uint)table_00[uVar7];
            if (table_00[uVar7] < 0xc00) {
LAB_002406d1:
              uVar3 = nextPair(table_00,(uint)bVar1,uVar3,(UChar *)0x0,left,&local_50,&local_4c);
              if (0xffff < uVar3) {
                if (uVar11 < (uVar3 & 0xffff)) {
                  uVar10 = 0xfc00fc00;
                  goto LAB_00240765;
                }
                uVar10 = uVar3 & 0xfff8fff8;
                goto LAB_0024065a;
              }
            }
            if (uVar3 < 0x1000) {
              if (uVar11 < uVar3) {
                uVar10 = 0xfc00;
                goto LAB_00240765;
              }
              uVar10 = uVar3 & 0xff8;
              if (uVar3 < 0xc00) {
                uVar10 = uVar3;
              }
              goto LAB_0024065a;
            }
          }
          uVar10 = (uint)((uVar3 & 0x380) < 0x180) * 0x4000000 + 0xfc00fc00;
        }
      }
LAB_00240765:
      while (uVar13 == 0) {
        lVar6 = (long)local_54;
        if (local_54 == rightLength) {
          uVar13 = 2;
          break;
        }
        bVar1 = local_48[lVar6];
        uVar7 = (ulong)(char)bVar1;
        iVar8 = (int)(lVar6 + 1);
        if ((long)uVar7 < 0) {
          if (bVar1 < 0xc6) {
            uVar7 = ((ulong)bVar1 * 0x40 + (ulong)local_48[lVar6 + 1]) - 0x3080;
            iVar8 = local_54 + 2;
            goto LAB_002407de;
          }
          local_54 = local_54 + 3;
          if (bVar1 == 0xe2) {
            uVar7 = (ulong)local_48[lVar6 + 2] | 0x100;
            iVar8 = local_54;
            goto LAB_002407de;
          }
          uVar3 = 3;
          if (local_48[lVar6 + 2] == 0xbe) goto LAB_002407ea;
          uVar3 = 0xfca8;
LAB_00240859:
          uVar13 = (uint)((uVar3 & 0x380) < 0x180) * 0x4000000 + 0xfc00fc00;
          break;
        }
LAB_002407de:
        local_54 = iVar8;
        uVar3 = (uint)table_00[uVar7];
        if (table_00[uVar7] < 0xc00) {
LAB_002407ea:
          uVar3 = nextPair(table_00,(uint)bVar1,uVar3,(UChar *)0x0,local_48,&local_54,&rightLength);
          if (uVar3 < 0x10000) goto LAB_00240810;
          if (uVar11 < (uVar3 & 0xffff)) {
            uVar13 = 0xfc00fc00;
            break;
          }
          uVar13 = uVar3 & 0xfff8fff8;
        }
        else {
LAB_00240810:
          if (0xfff < uVar3) goto LAB_00240859;
          if (uVar11 < uVar3) {
            uVar13 = 0xfc00;
            break;
          }
          uVar13 = uVar3 & 0xff8;
          if (uVar3 < 0xc00) {
            uVar13 = uVar3;
          }
        }
      }
      if (uVar10 == uVar13) {
        uVar13 = 0;
        bVar14 = uVar10 == 2;
        uVar10 = 0;
        if (bVar14) {
          return 0;
        }
      }
      else {
        uVar3 = uVar10 & 0xffff;
        uVar5 = uVar13 & 0xffff;
        if (uVar3 != (uVar13 & 0xffff)) {
LAB_00240633:
          uVar11 = -(uint)(uVar3 < uVar5);
LAB_0024063b:
          return uVar11 | 1;
        }
        if (uVar10 == 2) {
          return 0;
        }
        uVar13 = uVar13 >> 0x10;
        uVar10 = uVar10 >> 0x10;
      }
      goto LAB_0024065a;
    }
  }
  return 0;
}

Assistant:

int32_t
CollationFastLatin::compareUTF8(const uint16_t *table, const uint16_t *primaries, int32_t options,
                                 const uint8_t *left, int32_t leftLength,
                                 const uint8_t *right, int32_t rightLength) {
    // Keep compareUTF16() and compareUTF8() in sync very closely!

    U_ASSERT((table[0] >> 8) == VERSION);
    table += (table[0] & 0xff);  // skip the header
    uint32_t variableTop = (uint32_t)options >> 16;  // see RuleBasedCollator::getFastLatinOptions()
    options &= 0xffff;  // needed for CollationSettings::getStrength() to work

    // Check for supported characters, fetch mini CEs, and compare primaries.
    int32_t leftIndex = 0, rightIndex = 0;
    /**
     * Single mini CE or a pair.
     * The current mini CE is in the lower 16 bits, the next one is in the upper 16 bits.
     * If there is only one, then it is in the lower bits, and the upper bits are 0.
     */
    uint32_t leftPair = 0, rightPair = 0;
    // Note: There is no need to assemble the code point.
    // We only need to look up the table entry for the character,
    // and nextPair() looks for whether c==0.
    for(;;) {
        // We fetch CEs until we get a non-ignorable primary or reach the end.
        while(leftPair == 0) {
            if(leftIndex == leftLength) {
                leftPair = EOS;
                break;
            }
            UChar32 c = left[leftIndex++];
            uint8_t t;
            if(c <= 0x7f) {
                leftPair = primaries[c];
                if(leftPair != 0) { break; }
                if(c <= 0x39 && c >= 0x30 && (options & CollationSettings::NUMERIC) != 0) {
                    return BAIL_OUT_RESULT;
                }
                leftPair = table[c];
            } else if(c <= LATIN_MAX_UTF8_LEAD && 0xc2 <= c && leftIndex != leftLength &&
                    0x80 <= (t = left[leftIndex]) && t <= 0xbf) {
                ++leftIndex;
                c = ((c - 0xc2) << 6) + t;
                leftPair = primaries[c];
                if(leftPair != 0) { break; }
                leftPair = table[c];
            } else {
                leftPair = lookupUTF8(table, c, left, leftIndex, leftLength);
            }
            if(leftPair >= MIN_SHORT) {
                leftPair &= SHORT_PRIMARY_MASK;
                break;
            } else if(leftPair > variableTop) {
                leftPair &= LONG_PRIMARY_MASK;
                break;
            } else {
                leftPair = nextPair(table, c, leftPair, NULL, left, leftIndex, leftLength);
                if(leftPair == BAIL_OUT) { return BAIL_OUT_RESULT; }
                leftPair = getPrimaries(variableTop, leftPair);
            }
        }

        while(rightPair == 0) {
            if(rightIndex == rightLength) {
                rightPair = EOS;
                break;
            }
            UChar32 c = right[rightIndex++];
            uint8_t t;
            if(c <= 0x7f) {
                rightPair = primaries[c];
                if(rightPair != 0) { break; }
                if(c <= 0x39 && c >= 0x30 && (options & CollationSettings::NUMERIC) != 0) {
                    return BAIL_OUT_RESULT;
                }
                rightPair = table[c];
            } else if(c <= LATIN_MAX_UTF8_LEAD && 0xc2 <= c && rightIndex != rightLength &&
                    0x80 <= (t = right[rightIndex]) && t <= 0xbf) {
                ++rightIndex;
                c = ((c - 0xc2) << 6) + t;
                rightPair = primaries[c];
                if(rightPair != 0) { break; }
                rightPair = table[c];
            } else {
                rightPair = lookupUTF8(table, c, right, rightIndex, rightLength);
            }
            if(rightPair >= MIN_SHORT) {
                rightPair &= SHORT_PRIMARY_MASK;
                break;
            } else if(rightPair > variableTop) {
                rightPair &= LONG_PRIMARY_MASK;
                break;
            } else {
                rightPair = nextPair(table, c, rightPair, NULL, right, rightIndex, rightLength);
                if(rightPair == BAIL_OUT) { return BAIL_OUT_RESULT; }
                rightPair = getPrimaries(variableTop, rightPair);
            }
        }

        if(leftPair == rightPair) {
            if(leftPair == EOS) { break; }
            leftPair = rightPair = 0;
            continue;
        }
        uint32_t leftPrimary = leftPair & 0xffff;
        uint32_t rightPrimary = rightPair & 0xffff;
        if(leftPrimary != rightPrimary) {
            // Return the primary difference.
            return (leftPrimary < rightPrimary) ? UCOL_LESS : UCOL_GREATER;
        }
        if(leftPair == EOS) { break; }
        leftPair >>= 16;
        rightPair >>= 16;
    }
    // In the following, we need to re-fetch each character because we did not buffer the CEs,
    // but we know that the string is well-formed and
    // only contains supported characters and mappings.

    // We might skip the secondary level but continue with the case level
    // which is turned on separately.
    if(CollationSettings::getStrength(options) >= UCOL_SECONDARY) {
        leftIndex = rightIndex = 0;
        leftPair = rightPair = 0;
        for(;;) {
            while(leftPair == 0) {
                if(leftIndex == leftLength) {
                    leftPair = EOS;
                    break;
                }
                UChar32 c = left[leftIndex++];
                if(c <= 0x7f) {
                    leftPair = table[c];
                } else if(c <= LATIN_MAX_UTF8_LEAD) {
                    leftPair = table[((c - 0xc2) << 6) + left[leftIndex++]];
                } else {
                    leftPair = lookupUTF8Unsafe(table, c, left, leftIndex);
                }
                if(leftPair >= MIN_SHORT) {
                    leftPair = getSecondariesFromOneShortCE(leftPair);
                    break;
                } else if(leftPair > variableTop) {
                    leftPair = COMMON_SEC_PLUS_OFFSET;
                    break;
                } else {
                    leftPair = nextPair(table, c, leftPair, NULL, left, leftIndex, leftLength);
                    leftPair = getSecondaries(variableTop, leftPair);
                }
            }

            while(rightPair == 0) {
                if(rightIndex == rightLength) {
                    rightPair = EOS;
                    break;
                }
                UChar32 c = right[rightIndex++];
                if(c <= 0x7f) {
                    rightPair = table[c];
                } else if(c <= LATIN_MAX_UTF8_LEAD) {
                    rightPair = table[((c - 0xc2) << 6) + right[rightIndex++]];
                } else {
                    rightPair = lookupUTF8Unsafe(table, c, right, rightIndex);
                }
                if(rightPair >= MIN_SHORT) {
                    rightPair = getSecondariesFromOneShortCE(rightPair);
                    break;
                } else if(rightPair > variableTop) {
                    rightPair = COMMON_SEC_PLUS_OFFSET;
                    break;
                } else {
                    rightPair = nextPair(table, c, rightPair, NULL, right, rightIndex, rightLength);
                    rightPair = getSecondaries(variableTop, rightPair);
                }
            }

            if(leftPair == rightPair) {
                if(leftPair == EOS) { break; }
                leftPair = rightPair = 0;
                continue;
            }
            uint32_t leftSecondary = leftPair & 0xffff;
            uint32_t rightSecondary = rightPair & 0xffff;
            if(leftSecondary != rightSecondary) {
                if((options & CollationSettings::BACKWARD_SECONDARY) != 0) {
                    // Full support for backwards secondary requires backwards contraction matching
                    // and moving backwards between merge separators.
                    return BAIL_OUT_RESULT;
                }
                return (leftSecondary < rightSecondary) ? UCOL_LESS : UCOL_GREATER;
            }
            if(leftPair == EOS) { break; }
            leftPair >>= 16;
            rightPair >>= 16;
        }
    }

    if((options & CollationSettings::CASE_LEVEL) != 0) {
        UBool strengthIsPrimary = CollationSettings::getStrength(options) == UCOL_PRIMARY;
        leftIndex = rightIndex = 0;
        leftPair = rightPair = 0;
        for(;;) {
            while(leftPair == 0) {
                if(leftIndex == leftLength) {
                    leftPair = EOS;
                    break;
                }
                UChar32 c = left[leftIndex++];
                leftPair = (c <= 0x7f) ? table[c] : lookupUTF8Unsafe(table, c, left, leftIndex);
                if(leftPair < MIN_LONG) {
                    leftPair = nextPair(table, c, leftPair, NULL, left, leftIndex, leftLength);
                }
                leftPair = getCases(variableTop, strengthIsPrimary, leftPair);
            }

            while(rightPair == 0) {
                if(rightIndex == rightLength) {
                    rightPair = EOS;
                    break;
                }
                UChar32 c = right[rightIndex++];
                rightPair = (c <= 0x7f) ? table[c] : lookupUTF8Unsafe(table, c, right, rightIndex);
                if(rightPair < MIN_LONG) {
                    rightPair = nextPair(table, c, rightPair, NULL, right, rightIndex, rightLength);
                }
                rightPair = getCases(variableTop, strengthIsPrimary, rightPair);
            }

            if(leftPair == rightPair) {
                if(leftPair == EOS) { break; }
                leftPair = rightPair = 0;
                continue;
            }
            uint32_t leftCase = leftPair & 0xffff;
            uint32_t rightCase = rightPair & 0xffff;
            if(leftCase != rightCase) {
                if((options & CollationSettings::UPPER_FIRST) == 0) {
                    return (leftCase < rightCase) ? UCOL_LESS : UCOL_GREATER;
                } else {
                    return (leftCase < rightCase) ? UCOL_GREATER : UCOL_LESS;
                }
            }
            if(leftPair == EOS) { break; }
            leftPair >>= 16;
            rightPair >>= 16;
        }
    }
    if(CollationSettings::getStrength(options) <= UCOL_SECONDARY) { return UCOL_EQUAL; }

    // Remove the case bits from the tertiary weight when caseLevel is on or caseFirst is off.
    UBool withCaseBits = CollationSettings::isTertiaryWithCaseBits(options);

    leftIndex = rightIndex = 0;
    leftPair = rightPair = 0;
    for(;;) {
        while(leftPair == 0) {
            if(leftIndex == leftLength) {
                leftPair = EOS;
                break;
            }
            UChar32 c = left[leftIndex++];
            leftPair = (c <= 0x7f) ? table[c] : lookupUTF8Unsafe(table, c, left, leftIndex);
            if(leftPair < MIN_LONG) {
                leftPair = nextPair(table, c, leftPair, NULL, left, leftIndex, leftLength);
            }
            leftPair = getTertiaries(variableTop, withCaseBits, leftPair);
        }

        while(rightPair == 0) {
            if(rightIndex == rightLength) {
                rightPair = EOS;
                break;
            }
            UChar32 c = right[rightIndex++];
            rightPair = (c <= 0x7f) ? table[c] : lookupUTF8Unsafe(table, c, right, rightIndex);
            if(rightPair < MIN_LONG) {
                rightPair = nextPair(table, c, rightPair, NULL, right, rightIndex, rightLength);
            }
            rightPair = getTertiaries(variableTop, withCaseBits, rightPair);
        }

        if(leftPair == rightPair) {
            if(leftPair == EOS) { break; }
            leftPair = rightPair = 0;
            continue;
        }
        uint32_t leftTertiary = leftPair & 0xffff;
        uint32_t rightTertiary = rightPair & 0xffff;
        if(leftTertiary != rightTertiary) {
            if(CollationSettings::sortsTertiaryUpperCaseFirst(options)) {
                // Pass through EOS and MERGE_WEIGHT
                // and keep real tertiary weights larger than the MERGE_WEIGHT.
                // Tertiary CEs (secondary ignorables) are not supported in fast Latin.
                if(leftTertiary > MERGE_WEIGHT) {
                    leftTertiary ^= CASE_MASK;
                }
                if(rightTertiary > MERGE_WEIGHT) {
                    rightTertiary ^= CASE_MASK;
                }
            }
            return (leftTertiary < rightTertiary) ? UCOL_LESS : UCOL_GREATER;
        }
        if(leftPair == EOS) { break; }
        leftPair >>= 16;
        rightPair >>= 16;
    }
    if(CollationSettings::getStrength(options) <= UCOL_TERTIARY) { return UCOL_EQUAL; }

    leftIndex = rightIndex = 0;
    leftPair = rightPair = 0;
    for(;;) {
        while(leftPair == 0) {
            if(leftIndex == leftLength) {
                leftPair = EOS;
                break;
            }
            UChar32 c = left[leftIndex++];
            leftPair = (c <= 0x7f) ? table[c] : lookupUTF8Unsafe(table, c, left, leftIndex);
            if(leftPair < MIN_LONG) {
                leftPair = nextPair(table, c, leftPair, NULL, left, leftIndex, leftLength);
            }
            leftPair = getQuaternaries(variableTop, leftPair);
        }

        while(rightPair == 0) {
            if(rightIndex == rightLength) {
                rightPair = EOS;
                break;
            }
            UChar32 c = right[rightIndex++];
            rightPair = (c <= 0x7f) ? table[c] : lookupUTF8Unsafe(table, c, right, rightIndex);
            if(rightPair < MIN_LONG) {
                rightPair = nextPair(table, c, rightPair, NULL, right, rightIndex, rightLength);
            }
            rightPair = getQuaternaries(variableTop, rightPair);
        }

        if(leftPair == rightPair) {
            if(leftPair == EOS) { break; }
            leftPair = rightPair = 0;
            continue;
        }
        uint32_t leftQuaternary = leftPair & 0xffff;
        uint32_t rightQuaternary = rightPair & 0xffff;
        if(leftQuaternary != rightQuaternary) {
            return (leftQuaternary < rightQuaternary) ? UCOL_LESS : UCOL_GREATER;
        }
        if(leftPair == EOS) { break; }
        leftPair >>= 16;
        rightPair >>= 16;
    }
    return UCOL_EQUAL;
}